

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::_::
ArrayDisposableOwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
::disposeImpl(ArrayDisposableOwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
              *this,void *param_1,size_t param_2,size_t param_3,size_t param_4,
             _func_void_void_ptr *param_5)

{
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *pOVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pOVar1 = (this->
           super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
           ).first.ptr;
  if (pOVar1 != (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0) {
    sVar2 = (this->
            super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
            ).first.size_;
    (this->
    super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    ).first.ptr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0;
    (this->
    super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    ).first.size_ = 0;
    pAVar3 = (this->
             super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
             ).first.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pOVar1,0x10,sVar2,sVar2,
               ArrayDisposer::
               Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_false>::
               destruct);
  }
  if ((this->
      super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
      ).
      super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
      .first.ptr != (DestructionOrderRecorder *)0x0) {
    (this->
    super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    ).
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    .first.ptr = (DestructionOrderRecorder *)0x0;
    (**((this->
        super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
        ).
        super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
        .first.disposer)->_vptr_Disposer)();
  }
  if ((this->
      super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
      ).
      super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
      .super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>.first.ptr !=
      (DestructionOrderRecorder *)0x0) {
    (this->
    super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    ).
    super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
    .super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>.first.ptr =
         (DestructionOrderRecorder *)0x0;
    (**((this->
        super_OwnedBundle<kj::Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
        ).
        super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
        .super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>.first.
       disposer)->_vptr_Disposer)();
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

void disposeImpl(void*, size_t, size_t, size_t, void (*)(void*)) const override { delete this; }